

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Loop.hpp
# Opt level: O2

int __thiscall uv::Loop::init(Loop *this,EVP_PKEY_CTX *ctx)

{
  int e;
  uv_loop_t *puVar1;
  int *in_RDX;
  error_code eVar2;
  
  if ((int)ctx == 0) {
    this->loop_ptr_ = &this->loop_;
    e = uv_loop_init(this);
    if (e != 0) {
      eVar2 = makeErrorCode(e);
      puVar1 = eVar2._0_8_;
      *in_RDX = eVar2._M_value;
      *(error_category **)(in_RDX + 2) = eVar2._M_cat;
      goto LAB_00103790;
    }
    puVar1 = this->loop_ptr_;
  }
  else {
    puVar1 = (uv_loop_t *)uv_default_loop();
    this->loop_ptr_ = puVar1;
  }
  if (puVar1 == (uv_loop_t *)0x0) {
    puVar1 = (uv_loop_t *)getCategory();
    *in_RDX = 0xc;
    *(uv_loop_t **)(in_RDX + 2) = puVar1;
  }
  else {
    puVar1->data = this;
  }
LAB_00103790:
  return (int)puVar1;
}

Assistant:

inline void Loop::init(bool is_default, std::error_code & ec)
	{
		if (is_default) {
			loop_ptr_ = uv_default_loop();
		}
		else {
			loop_ptr_ = &loop_;
			auto status = uv_loop_init(loop_ptr_);
			if (status != 0) {
				ec = makeErrorCode(status);
				return;
			}
		}

		if (loop_ptr_ == nullptr) {
			ec = makeErrorCode(ENOMEM);
			return;
		}

		loop_ptr_->data = this;
	}